

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

bool getIntArguments<4>(char **lp,aint (*args) [4],bool (*argOptional) [4])

{
  bool bVar1;
  int iVar2;
  byte local_31;
  bool local_30 [4];
  int local_2c;
  aint val;
  int i;
  bool (*argOptional_local) [4];
  aint (*args_local) [4];
  char **lp_local;
  
  local_2c = 0;
  _val = argOptional;
  argOptional_local = (bool (*) [4])args;
  args_local = (aint (*) [4])lp;
  while( true ) {
    if (3 < local_2c) {
      bVar1 = comma((char **)args_local);
      return (bool)((bVar1 ^ 0xffU) & 1);
    }
    if ((0 < local_2c) && (bVar1 = comma((char **)args_local), !bVar1)) break;
    iVar2 = ParseExpression((char **)args_local,(aint *)local_30);
    if (iVar2 == 0) {
      local_31 = 0;
      if (local_2c == 0) {
        local_31 = (*_val)[0];
      }
      return (bool)(local_31 & 1);
    }
    argOptional_local[local_2c] = local_30;
    local_2c = local_2c + 1;
  }
  return (bool)((*_val)[local_2c] & 1);
}

Assistant:

bool getIntArguments(char*& lp, aint (&args)[argsN], const bool (&argOptional)[argsN]) {
	for (int i = 0; i < argsN; ++i) {
		if (0 < i && !comma(lp)) return argOptional[i];
		aint val;				// temporary variable to preserve original value in case of error
		if (!ParseExpression(lp, val)) return (0 == i) && argOptional[i];
		args[i] = val;
	}
	return !comma(lp);
}